

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O2

int32_t utrie_unserializeDummy_63
                  (UTrie *trie,void *data,int32_t length,uint32_t initialValue,
                  uint32_t leadUnitValue,UBool make16BitTrie,UErrorCode *pErrorCode)

{
  uint32_t *puVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  
  uVar5 = 0xffffffff;
  if ((pErrorCode != (UErrorCode *)0x0) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    trie->indexLength = 0x820;
    uVar3 = (uint)(leadUnitValue != initialValue);
    trie->dataLength = uVar3 * 0x20 + 0x100;
    uVar5 = uVar3 * 0x80 + 0x400 | 0x1040;
    if (make16BitTrie != '\0') {
      uVar5 = uVar3 * 0x40 + 0x1240;
    }
    if (length < (int)uVar5) {
      *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
    }
    else {
      trie->isLatin1Linear = '\x01';
      trie->initialValue = initialValue;
      trie->index = (uint16_t *)data;
      if (make16BitTrie == '\0') {
        memset(data,0,0x1040);
        if (leadUnitValue != initialValue) {
          for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
            *(undefined2 *)((long)data + lVar4 * 2 + 0xd80) = 0x40;
          }
        }
        iVar2 = trie->indexLength;
        puVar1 = (uint32_t *)((long)data + (long)iVar2 * 2);
        trie->data32 = puVar1;
        for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
          puVar1[lVar4] = initialValue;
        }
        if (leadUnitValue != initialValue) {
          for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
            *(uint32_t *)((long)data + lVar4 * 4 + (long)iVar2 * 2 + 0x400) = leadUnitValue;
          }
        }
      }
      else {
        for (lVar4 = 0; lVar4 != 0x820; lVar4 = lVar4 + 1) {
          *(undefined2 *)((long)data + lVar4 * 2) = 0x208;
        }
        if (leadUnitValue != initialValue) {
          for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
            *(undefined2 *)((long)data + lVar4 * 2 + 0xd80) = 0x248;
          }
        }
        trie->data32 = (uint32_t *)0x0;
        for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
          *(short *)((long)data + lVar4 * 2 + 0x1040) = (short)initialValue;
        }
        if (leadUnitValue != initialValue) {
          for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
            *(short *)((long)data + lVar4 * 2 + 0x1240) = (short)leadUnitValue;
          }
        }
      }
      trie->getFoldingOffset = utrie_defaultGetFoldingOffset_63;
    }
  }
  return uVar5;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrie_unserializeDummy(UTrie *trie,
                       void *data, int32_t length,
                       uint32_t initialValue, uint32_t leadUnitValue,
                       UBool make16BitTrie,
                       UErrorCode *pErrorCode) {
    uint16_t *p16;
    int32_t actualLength, latin1Length, i, limit;
    uint16_t block;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return -1;
    }

    /* calculate the actual size of the dummy trie data */

    /* max(Latin-1, block 0) */
    latin1Length= 256; /*UTRIE_SHIFT<=8 ? 256 : UTRIE_DATA_BLOCK_LENGTH;*/

    trie->indexLength=UTRIE_BMP_INDEX_LENGTH+UTRIE_SURROGATE_BLOCK_COUNT;
    trie->dataLength=latin1Length;
    if(leadUnitValue!=initialValue) {
        trie->dataLength+=UTRIE_DATA_BLOCK_LENGTH;
    }

    actualLength=trie->indexLength*2;
    if(make16BitTrie) {
        actualLength+=trie->dataLength*2;
    } else {
        actualLength+=trie->dataLength*4;
    }

    /* enough space for the dummy trie? */
    if(length<actualLength) {
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
        return actualLength;
    }

    trie->isLatin1Linear=TRUE;
    trie->initialValue=initialValue;

    /* fill the index and data arrays */
    p16=(uint16_t *)data;
    trie->index=p16;

    if(make16BitTrie) {
        /* indexes to block 0 */
        block=(uint16_t)(trie->indexLength>>UTRIE_INDEX_SHIFT);
        limit=trie->indexLength;
        for(i=0; i<limit; ++i) {
            p16[i]=block;
        }

        if(leadUnitValue!=initialValue) {
            /* indexes for lead surrogate code units to the block after Latin-1 */
            block+=(uint16_t)(latin1Length>>UTRIE_INDEX_SHIFT);
            i=0xd800>>UTRIE_SHIFT;
            limit=0xdc00>>UTRIE_SHIFT;
            for(; i<limit; ++i) {
                p16[i]=block;
            }
        }

        trie->data32=NULL;

        /* Latin-1 data */
        p16+=trie->indexLength;
        for(i=0; i<latin1Length; ++i) {
            p16[i]=(uint16_t)initialValue;
        }

        /* data for lead surrogate code units */
        if(leadUnitValue!=initialValue) {
            limit=latin1Length+UTRIE_DATA_BLOCK_LENGTH;
            for(/* i=latin1Length */; i<limit; ++i) {
                p16[i]=(uint16_t)leadUnitValue;
            }
        }
    } else {
        uint32_t *p32;

        /* indexes to block 0 */
        uprv_memset(p16, 0, trie->indexLength*2);

        if(leadUnitValue!=initialValue) {
            /* indexes for lead surrogate code units to the block after Latin-1 */
            block=(uint16_t)(latin1Length>>UTRIE_INDEX_SHIFT);
            i=0xd800>>UTRIE_SHIFT;
            limit=0xdc00>>UTRIE_SHIFT;
            for(; i<limit; ++i) {
                p16[i]=block;
            }
        }

        trie->data32=p32=(uint32_t *)(p16+trie->indexLength);

        /* Latin-1 data */
        for(i=0; i<latin1Length; ++i) {
            p32[i]=initialValue;
        }

        /* data for lead surrogate code units */
        if(leadUnitValue!=initialValue) {
            limit=latin1Length+UTRIE_DATA_BLOCK_LENGTH;
            for(/* i=latin1Length */; i<limit; ++i) {
                p32[i]=leadUnitValue;
            }
        }
    }

    trie->getFoldingOffset=utrie_defaultGetFoldingOffset;

    return actualLength;
}